

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

int duckdb::Cast::Operation<short,_int>(short input)

{
  bool bVar1;
  InvalidInputException *this;
  int result;
  short in_stack_000001ae;
  string *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  int local_8;
  
  bVar1 = TryCast::Operation<short,_int>
                    ((int16_t)((ulong)in_stack_ffffffffffffffc0 >> 0x30),
                     (int32_t *)in_stack_ffffffffffffffb8,false);
  if (!bVar1) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    CastExceptionText<short,_int>(in_stack_000001ae);
    InvalidInputException::InvalidInputException(this,in_stack_ffffffffffffffb8);
    __cxa_throw(this,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException)
    ;
  }
  return local_8;
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}